

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cilk_fiber.cpp
# Opt level: O0

void cilk_fiber_remove_reference_from_self_and_resume_other
               (cilk_fiber *self,cilk_fiber_pool *self_pool,cilk_fiber *other)

{
  int iVar1;
  cilk_fiber_pool *in_RSI;
  
  iVar1 = cilk_fiber_pool_sanity_check(in_RSI,"remove_reference_from_self_resume_other");
  if (iVar1 != 0) {
    cilk_fiber::remove_reference_from_self_and_resume_other(self,self_pool,other);
  }
  __cilkrts_bug("%s:%d: cilk assertion failed: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/passlab[P]intel-cilk-runtime/runtime/cilk_fiber.cpp"
                ,0x187,
                "cilk_fiber_pool_sanity_check(self_pool, \"remove_reference_from_self_resume_other\")"
               );
}

Assistant:

NORETURN
cilk_fiber_remove_reference_from_self_and_resume_other(cilk_fiber*      self,
                                                       cilk_fiber_pool* self_pool,
                                                       cilk_fiber*      other)
{
#if FIBER_DEBUG >= 3
    __cilkrts_worker* w = __cilkrts_get_tls_worker();
    fprintf(stderr, "W=%d: cilk_fiber_deactivate_self_and_resume_other: self=%p, other=%p\n",
            w->self,
            self, other);
#endif
    CILK_ASSERT(cilk_fiber_pool_sanity_check(self_pool, "remove_reference_from_self_resume_other"));
    self->remove_reference_from_self_and_resume_other(self_pool, other);
    
    // We should never return here. 
}